

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O0

void rec_for_check(jit_State *J,IRType t,int dir,TRef stop,TRef step,int init)

{
  IRRef1 IVar1;
  short sVar2;
  TRef TVar3;
  int iVar4;
  IRRef1 local_98;
  int32_t k_1;
  TRef tr;
  int32_t k;
  TRef zero;
  int init_local;
  TRef step_local;
  TRef stop_local;
  int dir_local;
  IRType t_local;
  jit_State *J_local;
  
  if ((step & 0xffff) < 0x8000) {
    if (((init != 0) && (t == IRT_INT)) && (0x7fff < (stop & 0xffff))) {
      iVar4 = -0x80000000;
      if (dir != 0) {
        iVar4 = 0x7fffffff;
      }
      sVar2 = 1;
      if (dir != 0) {
        sVar2 = 2;
      }
      TVar3 = lj_ir_kint(J,iVar4 - (J->cur).ir[step & 0xffff].field_1.op12);
      (J->fold).ins.field_0.ot = sVar2 << 8 | 0x93;
      (J->fold).ins.field_0.op1 = (IRRef1)stop;
      (J->fold).ins.field_0.op2 = (IRRef1)TVar3;
      lj_opt_fold(J);
    }
  }
  else {
    if (t == IRT_INT) {
      TVar3 = lj_ir_kint(J,0);
      local_98 = (IRRef1)TVar3;
    }
    else {
      TVar3 = lj_ir_knum_u64(J,0);
      local_98 = (IRRef1)TVar3;
    }
    IVar1 = (IRRef1)step;
    (J->fold).ins.field_0.ot = (ushort)(dir != 0) << 8 | (ushort)t | 0x80;
    (J->fold).ins.field_0.op1 = IVar1;
    (J->fold).ins.field_0.op2 = local_98;
    lj_opt_fold(J);
    if ((init != 0) && (t == IRT_INT)) {
      if ((stop & 0xffff) < 0x8000) {
        iVar4 = (J->cur).ir[stop & 0xffff].i;
        if (dir == 0) {
          if (iVar4 < 0) {
            TVar3 = lj_ir_kint(J,-0x80000000 - iVar4);
            (J->fold).ins.field_0.ot = 0x193;
            (J->fold).ins.field_0.op1 = IVar1;
            (J->fold).ins.field_0.op2 = (IRRef1)TVar3;
            lj_opt_fold(J);
          }
        }
        else if (0 < iVar4) {
          TVar3 = lj_ir_kint(J,0x7fffffff - iVar4);
          (J->fold).ins.field_0.ot = 0x293;
          (J->fold).ins.field_0.op1 = IVar1;
          (J->fold).ins.field_0.op2 = (IRRef1)TVar3;
          lj_opt_fold(J);
        }
      }
      else {
        (J->fold).ins.field_0.ot = 0x3593;
        (J->fold).ins.field_0.op1 = IVar1;
        (J->fold).ins.field_0.op2 = (IRRef1)stop;
        TVar3 = lj_opt_fold(J);
        (J->fold).ins.field_0.ot = 0x1213;
        (J->fold).ins.field_0.op1 = (IRRef1)TVar3;
        (J->fold).ins.field_0.op2 = 0;
        lj_opt_fold(J);
      }
    }
  }
  return;
}

Assistant:

static void rec_for_check(jit_State *J, IRType t, int dir,
			  TRef stop, TRef step, int init)
{
  if (!tref_isk(step)) {
    /* Non-constant step: need a guard for the direction. */
    TRef zero = (t == IRT_INT) ? lj_ir_kint(J, 0) : lj_ir_knum_zero(J);
    emitir(IRTG(dir ? IR_GE : IR_LT, t), step, zero);
    /* Add hoistable overflow checks for a narrowed FORL index. */
    if (init && t == IRT_INT) {
      if (tref_isk(stop)) {
	/* Constant stop: optimize check away or to a range check for step. */
	int32_t k = IR(tref_ref(stop))->i;
	if (dir) {
	  if (k > 0)
	    emitir(IRTGI(IR_LE), step, lj_ir_kint(J, (int32_t)0x7fffffff-k));
	} else {
	  if (k < 0)
	    emitir(IRTGI(IR_GE), step, lj_ir_kint(J, (int32_t)0x80000000-k));
	}
      } else {
	/* Stop+step variable: need full overflow check. */
	TRef tr = emitir(IRTGI(IR_ADDOV), step, stop);
	emitir(IRTI(IR_USE), tr, 0);  /* ADDOV is weak. Avoid dead result. */
      }
    }
  } else if (init && t == IRT_INT && !tref_isk(stop)) {
    /* Constant step: optimize overflow check to a range check for stop. */
    int32_t k = IR(tref_ref(step))->i;
    k = (int32_t)(dir ? 0x7fffffff : 0x80000000) - k;
    emitir(IRTGI(dir ? IR_LE : IR_GE), stop, lj_ir_kint(J, k));
  }
}